

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void __thiscall Debugger::EnterDebugMode(Debugger *this)

{
  bool bVar1;
  reference pvVar2;
  element_type *peVar3;
  EmmyFacade *this_00;
  int local_7c;
  shared_ptr<EvalContext> local_78;
  shared_ptr<EvalContext> local_68;
  byte local_51;
  undefined1 local_50 [7];
  bool skip;
  value_type evalContext;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lockEval;
  unique_lock<std::mutex> lock;
  Debugger *this_local;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&lockEval._M_owns,&this->runMtx);
  this->blocking = true;
  do {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->evalMtx);
    bVar1 = std::
            queue<std::shared_ptr<EvalContext>,_std::deque<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>_>
            ::empty(&this->evalQueue);
    if ((bVar1) && ((this->blocking & 1U) != 0)) {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_30);
      std::condition_variable::wait((unique_lock *)&this->cvRun);
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_30);
    }
    bVar1 = std::
            queue<std::shared_ptr<EvalContext>,_std::deque<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>_>
            ::empty(&this->evalQueue);
    if (bVar1) {
      local_7c = 3;
    }
    else {
      pvVar2 = std::
               queue<std::shared_ptr<EvalContext>,_std::deque<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>_>
               ::front(&this->evalQueue);
      std::shared_ptr<EvalContext>::shared_ptr((shared_ptr<EvalContext> *)local_50,pvVar2);
      std::
      queue<std::shared_ptr<EvalContext>,_std::deque<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>_>
      ::pop(&this->evalQueue);
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_30);
      local_51 = this->skipHook & 1;
      this->skipHook = true;
      std::shared_ptr<EvalContext>::shared_ptr(&local_68,(shared_ptr<EvalContext> *)local_50);
      bVar1 = DoEval(this,&local_68);
      peVar3 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
      peVar3->success = bVar1;
      std::shared_ptr<EvalContext>::~shared_ptr(&local_68);
      this->skipHook = (bool)(local_51 & 1);
      this_00 = EmmyFacade::Get();
      std::shared_ptr<EvalContext>::shared_ptr(&local_78,(shared_ptr<EvalContext> *)local_50);
      EmmyFacade::OnEvalResult(this_00,&local_78);
      std::shared_ptr<EvalContext>::~shared_ptr(&local_78);
      local_7c = 2;
      std::shared_ptr<EvalContext>::~shared_ptr((shared_ptr<EvalContext> *)local_50);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  } while (local_7c == 2);
  ClearCache(this);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&lockEval._M_owns);
  return;
}

Assistant:

void Debugger::EnterDebugMode() {
	std::unique_lock<std::mutex> lock(runMtx);

	blocking = true;
	while (true) {
		std::unique_lock<std::mutex> lockEval(evalMtx);
		if (evalQueue.empty() && blocking) {
			lockEval.unlock();
			cvRun.wait(lock);
			lockEval.lock();
		}
		if (!evalQueue.empty()) {
			const auto evalContext = evalQueue.front();
			evalQueue.pop();
			lockEval.unlock();
			const bool skip = skipHook;
			skipHook = true;
			evalContext->success = DoEval(evalContext);
			skipHook = skip;
			EmmyFacade::Get().OnEvalResult(evalContext);
			continue;
		}
		break;
	}
	ClearCache();
}